

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O2

void __thiscall cmCTestP4::DescribeParser::DoDiffLine(DescribeParser *this)

{
  RegularExpression *this_00;
  bool bVar1;
  long lVar2;
  string action;
  string Path;
  Change change;
  
  this_00 = &this->RegexDiff;
  bVar1 = cmsys::RegularExpression::find(this_00,&(this->super_LineParser).Line);
  if (bVar1) {
    change.Action = '?';
    change.Path._M_dataplus._M_p = (pointer)&change.Path.field_2;
    change.Path._M_string_length = 0;
    change.Path.field_2._M_local_buf[0] = '\0';
    cmsys::RegularExpressionMatch::match_abi_cxx11_(&Path,&this_00->regmatch,1);
    if ((((2 < Path._M_string_length) && (*Path._M_dataplus._M_p == '/')) &&
        (Path._M_dataplus._M_p[1] == '/')) &&
       (lVar2 = std::__cxx11::string::find((char)&Path,0x2f), lVar2 != -1)) {
      std::__cxx11::string::substr((ulong)&action,(ulong)&Path);
      std::__cxx11::string::operator=((string *)&Path,(string *)&action);
      std::__cxx11::string::~string((string *)&action);
    }
    std::__cxx11::string::_M_assign((string *)&change.Path);
    cmsys::RegularExpressionMatch::match_abi_cxx11_(&action,&this_00->regmatch,2);
    bVar1 = std::operator==(&action,"add");
    if (bVar1) {
      change.Action = 'A';
    }
    else {
      bVar1 = std::operator==(&action,"delete");
      if (bVar1) {
        change.Action = 'D';
      }
      else {
        bVar1 = std::operator==(&action,"edit");
        if ((bVar1) || (bVar1 = std::operator==(&action,"integrate"), bVar1)) {
          change.Action = 'M';
        }
      }
    }
    std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::push_back
              (&this->Changes,&change);
    std::__cxx11::string::~string((string *)&action);
    std::__cxx11::string::~string((string *)&Path);
    std::__cxx11::string::~string((string *)&change.Path);
    return;
  }
  return;
}

Assistant:

void DoDiffLine()
  {
    if (this->RegexDiff.find(this->Line)) {
      Change change;
      std::string Path = this->RegexDiff.match(1);
      if (Path.length() > 2 && Path[0] == '/' && Path[1] == '/') {
        size_t found = Path.find('/', 2);
        if (found != std::string::npos) {
          Path = Path.substr(found + 1);
        }
      }

      change.Path = Path;
      std::string action = this->RegexDiff.match(2);

      if (action == "add") {
        change.Action = 'A';
      } else if (action == "delete") {
        change.Action = 'D';
      } else if (action == "edit" || action == "integrate") {
        change.Action = 'M';
      }

      this->Changes.push_back(change);
    }
  }